

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::AND_AB_Y(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  
  this->cycles = 4;
  uVar2 = GetWord(this);
  this->cycles = this->cycles - 1;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(ushort)(this->Y + uVar2));
  bVar1 = (byte)iVar3 & this->A;
  this->A = bVar1;
  (this->field_6).ps = bVar1 & 0x80 | (bVar1 == 0) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::AND_AB_Y()
{
    cycles = 4;
    A &= ReadByte((uint16_t)(GetWord() + Y));
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}